

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

int rd_try_subblock(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp,
                   int is_last,int mi_row,int mi_col,BLOCK_SIZE subsize,RD_STATS best_rdcost,
                   RD_STATS *sum_rdc,PARTITION_TYPE partition,PICK_MODE_CONTEXT *this_ctx)

{
  EncQuantDequantParams *pEVar1;
  undefined4 uVar2;
  long lVar3;
  RD_STATS best_rd;
  undefined8 in_RCX;
  undefined8 in_RDX;
  PICK_MODE_CONTEXT *in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  undefined4 in_R9D;
  undefined1 in_stack_00000026;
  undefined1 in_stack_00000027;
  TokenExtra **in_stack_00000028;
  undefined7 in_stack_00000030;
  BLOCK_SIZE in_stack_00000037;
  int in_stack_00000038;
  int in_stack_0000003c;
  AV1_COMP *in_stack_00000040;
  byte in_stack_00000048;
  undefined7 in_stack_00000049;
  RD_STATS this_rdc;
  RD_STATS rdcost_remaining;
  int orig_mult;
  MACROBLOCK *x;
  RD_STATS *pRVar4;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  RD_STATS *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  int mult;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  MACROBLOCK *in_stack_ffffffffffffff48;
  AV1_COMP *in_stack_ffffffffffffff50;
  MB_MODE_INFO *mbmi;
  int local_98;
  long local_90;
  RD_STATS *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  MACROBLOCK *in_stack_ffffffffffffff90;
  TileDataEnc *in_stack_ffffffffffffff98;
  AV1_COMP *in_stack_ffffffffffffffa0;
  PARTITION_TYPE in_stack_ffffffffffffffb0;
  BLOCK_SIZE in_stack_ffffffffffffffb8;
  PICK_MODE_CONTEXT *pPVar5;
  int local_c;
  
  mult = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  mbmi = (MB_MODE_INFO *)&stack0x00000018;
  uVar2 = *(undefined4 *)(in_RSI[0x23].txb_entropy_ctx + 2);
  pRVar4 = (RD_STATS *)0x0;
  pPVar5 = in_RSI;
  setup_block_rdmult(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40,
                     (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff38 >> 0x38),
                     (AQ_MODE)((ulong)in_stack_ffffffffffffff38 >> 0x30),mbmi);
  av1_rd_cost_update(in_stack_ffffffffffffff24,pRVar4);
  av1_rd_stats_subtraction
            (mult,in_stack_ffffffffffffff28,
             (RD_STATS *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),pRVar4);
  pRVar4 = (RD_STATS *)CONCAT44((int)((ulong)pRVar4 >> 0x20),(uint)in_stack_00000048);
  best_rd.zero_rate = in_R8D;
  best_rd.rate = in_R9D;
  best_rd.dist = in_RCX;
  best_rd.rdcost = in_RDX;
  best_rd.sse = (int64_t)pPVar5;
  best_rd._32_8_ = in_RDI;
  pick_sb_modes(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,in_RSI,best_rd);
  if (local_98 == 0x7fffffff) {
    pEVar1 = &in_stack_00000040->enc_quant_dequant_params;
    *(int16_t *)((long)((pEVar1->quants).y_quant + 0) + 0) = -1;
    *(int16_t *)((long)((pEVar1->quants).y_quant + 0) + 2) = -1;
    *(int16_t *)((long)((pEVar1->quants).y_quant + 0) + 4) = -1;
    *(int16_t *)((long)((pEVar1->quants).y_quant + 0) + 6) = 0x7fff;
  }
  else {
    *(int *)&in_stack_00000040->ppi = local_98 + *(int *)&in_stack_00000040->ppi;
    *(long *)&in_stack_00000040->field_0x8 = local_90 + *(long *)&in_stack_00000040->field_0x8;
    av1_rd_cost_update(in_stack_ffffffffffffff24,pRVar4);
  }
  lVar3._0_1_ = mbmi->ref_frame[0];
  lVar3._1_1_ = mbmi->ref_frame[1];
  lVar3._2_2_ = *(undefined2 *)&mbmi->field_0x12;
  lVar3._4_4_ = mbmi->interp_filters;
  if (*(long *)(in_stack_00000040->enc_quant_dequant_params).quants.y_quant[0] < lVar3) {
    if (in_R8D == 0) {
      av1_update_state((AV1_COMP *)this_rdc._0_8_,
                       (ThreadData_conflict *)CONCAT71(in_stack_00000049,in_stack_00000048),
                       (PICK_MODE_CONTEXT *)in_stack_00000040,in_stack_0000003c,in_stack_00000038,
                       in_stack_00000037,(RUN_TYPE)this_rdc.rdcost);
      encode_superblock(in_stack_00000040,
                        (TileDataEnc *)CONCAT44(in_stack_0000003c,in_stack_00000038),
                        (ThreadData_conflict *)CONCAT17(in_stack_00000037,in_stack_00000030),
                        in_stack_00000028,in_stack_00000027,in_stack_00000026,(int *)this_rdc._0_8_)
      ;
    }
    *(undefined4 *)(in_RSI[0x23].txb_entropy_ctx + 2) = uVar2;
    local_c = 1;
  }
  else {
    *(undefined4 *)(in_RSI[0x23].txb_entropy_ctx + 2) = uVar2;
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int rd_try_subblock(AV1_COMP *const cpi, ThreadData *td,
                           TileDataEnc *tile_data, TokenExtra **tp, int is_last,
                           int mi_row, int mi_col, BLOCK_SIZE subsize,
                           RD_STATS best_rdcost, RD_STATS *sum_rdc,
                           PARTITION_TYPE partition,
                           PICK_MODE_CONTEXT *this_ctx) {
  MACROBLOCK *const x = &td->mb;
  const int orig_mult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, subsize, NO_AQ, NULL);

  av1_rd_cost_update(x->rdmult, &best_rdcost);

  RD_STATS rdcost_remaining;
  av1_rd_stats_subtraction(x->rdmult, &best_rdcost, sum_rdc, &rdcost_remaining);
  RD_STATS this_rdc;
  pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &this_rdc, partition,
                subsize, this_ctx, rdcost_remaining);

  if (this_rdc.rate == INT_MAX) {
    sum_rdc->rdcost = INT64_MAX;
  } else {
    sum_rdc->rate += this_rdc.rate;
    sum_rdc->dist += this_rdc.dist;
    av1_rd_cost_update(x->rdmult, sum_rdc);
  }

  if (sum_rdc->rdcost >= best_rdcost.rdcost) {
    x->rdmult = orig_mult;
    return 0;
  }

  if (!is_last) {
    av1_update_state(cpi, td, this_ctx, mi_row, mi_col, subsize, 1);
    encode_superblock(cpi, tile_data, td, tp, DRY_RUN_NORMAL, subsize, NULL);
  }

  x->rdmult = orig_mult;
  return 1;
}